

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

boolean bydoor(level *lev,xchar x,xchar y)

{
  char cVar1;
  int typ;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  if (((((x + 1 < 1) || (0x4f < x + 1)) || (y < '\0')) || ('\x14' < y)) ||
     ((cVar1 = lev->locations[x + 1][y].typ, cVar1 != '\x17' && (cVar1 != '\x0f')))) {
    if ((((x + -1 < 1) || (0x4f < x + -1)) || ((y < '\0' || ('\x14' < y)))) ||
       ((cVar1 = lev->locations[x + -1][y].typ, cVar1 != '\x17' && (cVar1 != '\x0f')))) {
      if ((((x < '\x01') || ('O' < x)) || (y + 1 < 0)) ||
         ((0x14 < y + 1 ||
          ((cVar1 = lev->locations[x][y + 1].typ, cVar1 != '\x17' && (cVar1 != '\x0f')))))) {
        if ((((x < '\x01') || ('O' < x)) || ((y + -1 < 0 || (0x14 < y + -1)))) ||
           ((cVar1 = lev->locations[x][y + -1].typ, cVar1 != '\x17' && (cVar1 != '\x0f')))) {
          lev_local._7_1_ = '\0';
        }
        else {
          lev_local._7_1_ = '\x01';
        }
      }
      else {
        lev_local._7_1_ = '\x01';
      }
    }
    else {
      lev_local._7_1_ = '\x01';
    }
  }
  else {
    lev_local._7_1_ = '\x01';
  }
  return lev_local._7_1_;
}

Assistant:

static boolean bydoor(struct level *lev, xchar x, xchar y)
{
	int typ;

	if (isok(x+1, y)) {
		typ = lev->locations[x+1][y].typ;
		if (IS_DOOR(typ) || typ == SDOOR) return TRUE;
	}
	if (isok(x-1, y)) {
		typ = lev->locations[x-1][y].typ;
		if (IS_DOOR(typ) || typ == SDOOR) return TRUE;
	}
	if (isok(x, y+1)) {
		typ = lev->locations[x][y+1].typ;
		if (IS_DOOR(typ) || typ == SDOOR) return TRUE;
	}
	if (isok(x, y-1)) {
		typ = lev->locations[x][y-1].typ;
		if (IS_DOOR(typ) || typ == SDOOR) return TRUE;
	}
	return FALSE;
}